

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCorrFunc.cpp
# Opt level: O0

void __thiscall
OpenMD::TimeCorrFunc<OpenMD::Vector<double,_4U>_>::correlateFrames
          (TimeCorrFunc<OpenMD::Vector<double,_4U>_> *this,int frame1,int frame2,int timeBin)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  reference pvVar4;
  reference piVar5;
  reference pvVar6;
  size_type sVar7;
  difference_type dVar8;
  ulong uVar9;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  int ssf2;
  int ssf1;
  Vector<double,_4U> zeroType;
  Vector<double,_4U> corrVal;
  iterator i2;
  iterator i1;
  vector<int,_std::allocator<int>_> s2;
  vector<int,_std::allocator<int>_> s1;
  int in_stack_fffffffffffffe08;
  int in_stack_fffffffffffffe0c;
  undefined4 in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe14;
  int in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  reference in_stack_fffffffffffffe20;
  int local_1cc;
  bool local_1b9;
  bool local_1a9;
  undefined1 local_190 [32];
  int *local_170;
  int *local_168;
  undefined1 local_160 [8];
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffea8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffeb0;
  undefined1 local_d8 [32];
  double local_b8;
  Vector<double,_4U> local_b0;
  double local_80;
  Vector<double,_4U> local_78;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_58;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_50 [7];
  int local_14;
  int local_10;
  int local_c;
  
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1907ee);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1907fb);
  __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::__normal_iterator
            (local_50);
  __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::__normal_iterator
            (&local_58);
  local_80 = 0.0;
  Vector<double,_4U>::Vector(&local_78,&local_80);
  local_b8 = 0.0;
  Vector<double,_4U>::Vector(&local_b0,&local_b8);
  if ((*(byte *)((long)in_RDI + 0xd42) & 1) == 0) {
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)(in_RDI + 0x1b5),(long)local_c);
    std::vector<int,_std::allocator<int>_>::operator=
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    if ((*(byte *)(in_RDI + 0x1a8) & 1) == 0) {
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)(in_RDI + 0x1b5),(long)local_10);
      std::vector<int,_std::allocator<int>_>::operator=
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    }
    else {
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)(in_RDI + 0x1b8),(long)local_10);
      std::vector<int,_std::allocator<int>_>::operator=
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    }
    local_50[0]._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)
                           CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    local_58._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)
                           CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    while( true ) {
      std::vector<int,_std::allocator<int>_>::end
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      local_1a9 = false;
      if (bVar2) {
        std::vector<int,_std::allocator<int>_>::end
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
        local_1a9 = __gnu_cxx::operator!=
                              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                               CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                               CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      }
      if (local_1a9 == false) break;
      while( true ) {
        std::vector<int,_std::allocator<int>_>::end
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
        bVar3 = __gnu_cxx::operator!=
                          ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                           (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
        bVar2 = false;
        if (bVar3) {
          piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(local_50);
          iVar1 = *piVar5;
          piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_58);
          bVar2 = iVar1 < *piVar5;
        }
        if (!bVar2) break;
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (local_50);
      }
      while( true ) {
        std::vector<int,_std::allocator<int>_>::end
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
        bVar3 = __gnu_cxx::operator!=
                          ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                           (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
        bVar2 = false;
        if (bVar3) {
          piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_58);
          iVar1 = *piVar5;
          piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(local_50);
          bVar2 = iVar1 < *piVar5;
        }
        if (!bVar2) break;
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&local_58);
      }
      std::vector<int,_std::allocator<int>_>::end
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      bVar2 = __gnu_cxx::operator==
                        ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      local_1b9 = true;
      if (!bVar2) {
        std::vector<int,_std::allocator<int>_>::end
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
        local_1b9 = __gnu_cxx::operator==
                              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                               CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                               CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      }
      if (local_1b9 != false) break;
      if ((*(byte *)(in_RDI + 5) & 1) == 0) {
        in_stack_fffffffffffffe08 = local_c;
        in_stack_fffffffffffffe0c = local_10;
        std::vector<int,_std::allocator<int>_>::begin
                  ((vector<int,_std::allocator<int>_> *)CONCAT44(local_10,local_c));
        dVar8 = __gnu_cxx::operator-
                          ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                           (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
        in_stack_fffffffffffffe10 = (undefined4)dVar8;
        std::vector<int,_std::allocator<int>_>::begin
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
        uVar9 = __gnu_cxx::operator-
                          ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                           (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
        (**(code **)(*in_RDI + 0x98))
                  (local_190,in_RDI,in_stack_fffffffffffffe08,in_stack_fffffffffffffe0c,
                   in_stack_fffffffffffffe10,uVar9 & 0xffffffff);
        Vector<double,_4U>::operator=
                  ((Vector<double,_4U> *)
                   CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                   (Vector<double,_4U> *)
                   CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
      }
      else {
        pvVar6 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)(in_RDI + 0x1c1),(long)local_c);
        std::vector<int,_std::allocator<int>_>::begin
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
        sVar7 = __gnu_cxx::operator-
                          ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                           (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar6,sVar7);
        iVar1 = *pvVar4;
        if ((*(byte *)(in_RDI + 0x1a8) & 1) == 0) {
          in_stack_fffffffffffffe20 =
               std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)(in_RDI + 0x1c1),(long)local_10);
          std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
          sVar7 = __gnu_cxx::operator-
                            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                             CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                             CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             (in_stack_fffffffffffffe20,sVar7);
          local_1cc = *pvVar4;
        }
        else {
          pvVar6 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 *)(in_RDI + 0x1c4),(long)local_10);
          std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
          sVar7 = __gnu_cxx::operator-
                            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                             CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                             CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar6,sVar7);
          local_1cc = *pvVar4;
        }
        if (iVar1 != local_1cc) break;
        in_stack_fffffffffffffe14 = local_c;
        in_stack_fffffffffffffe18 = local_10;
        local_168 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                     ((vector<int,_std::allocator<int>_> *)
                                      CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08))
        ;
        dVar8 = __gnu_cxx::operator-
                          ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                           (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
        in_stack_fffffffffffffe1c = (undefined4)dVar8;
        local_170 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                     ((vector<int,_std::allocator<int>_> *)
                                      CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08))
        ;
        uVar9 = __gnu_cxx::operator-
                          ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                           (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
        (**(code **)(*in_RDI + 0x98))
                  (local_160,in_RDI,in_stack_fffffffffffffe14,in_stack_fffffffffffffe18,
                   in_stack_fffffffffffffe1c,uVar9 & 0xffffffff);
        Vector<double,_4U>::operator=
                  ((Vector<double,_4U> *)
                   CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                   (Vector<double,_4U> *)
                   CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
      }
      std::vector<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>::
      operator[]((vector<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_> *
                 )(in_RDI + 8),(long)local_14);
      Vector<double,_4U>::operator+=
                ((Vector<double,_4U> *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10)
                 ,(Vector<double,_4U> *)
                  CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xb),(long)local_14);
      *pvVar4 = *pvVar4 + 1;
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (local_50);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_58);
    }
  }
  else {
    (**(code **)(*in_RDI + 0x60))(local_d8,in_RDI,local_c,local_10);
    Vector<double,_4U>::operator=
              ((Vector<double,_4U> *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
               (Vector<double,_4U> *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
    std::vector<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>::
    operator[]((vector<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_> *)
               (in_RDI + 8),(long)local_14);
    Vector<double,_4U>::operator+=
              ((Vector<double,_4U> *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
               (Vector<double,_4U> *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xb),(long)local_14);
    *pvVar4 = *pvVar4 + 1;
  }
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffe20);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffe20);
  return;
}

Assistant:

void TimeCorrFunc<T>::correlateFrames(int frame1, int frame2, int timeBin) {
    std::vector<int> s1;
    std::vector<int> s2;

    std::vector<int>::iterator i1;
    std::vector<int>::iterator i2;

    T corrVal(0.0);
    T zeroType(0.0);

    if (doSystemProperties_) {
      corrVal = calcCorrVal(frame1, frame2);
      histogram_[timeBin] += corrVal;
      count_[timeBin]++;

    } else {
      s1 = sele1ToIndex_[frame1];

      if (uniqueSelections_)
        s2 = sele2ToIndex_[frame2];
      else
        s2 = sele1ToIndex_[frame2];

      for (i1 = s1.begin(), i2 = s2.begin(); i1 != s1.end() && i2 != s2.end();
           ++i1, ++i2) {
        // If the selections are dynamic, they might not have the
        // same objects in both frames, so we need to roll either of
        // the selections until we have the same object to
        // correlate.

        while (i1 != s1.end() && *i1 < *i2) {
          ++i1;
        }

        while (i2 != s2.end() && *i2 < *i1) {
          ++i2;
        }

        if (i1 == s1.end() || i2 == s2.end()) break;

	if (selectionModeRestart_) {
	  
	  int ssf1 = selection1StartFrame_[frame1][i1 - s1.begin()];
	  int ssf2 = uniqueSelections_ ?
	    selection2StartFrame_[frame2][i2 - s2.begin()] :
	    selection1StartFrame_[frame2][i2 - s2.begin()];


	  if (ssf1 != ssf2) break;
	  corrVal = calcCorrVal(frame1, frame2,
				i1 - s1.begin(), i2 - s2.begin());	  
	} else {
	  
	  corrVal = calcCorrVal(frame1, frame2,
				i1 - s1.begin(), i2 - s2.begin());        
	}
        histogram_[timeBin] += corrVal;
        count_[timeBin]++;
      }
    }
  }